

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void __thiscall crnlib::mipmapped_texture::assign(mipmapped_texture *this,face_vec *faces)

{
  uint uVar1;
  vector<crnlib::mip_level_*> *pvVar2;
  mip_level *pmVar3;
  vector<crnlib::mip_level_*> *pvVar4;
  
  if (faces->m_size != 0) {
    free_all_mips(this);
    pvVar2 = faces->m_p;
    pmVar3 = *pvVar2->m_p;
    this->m_width = pmVar3->m_width;
    this->m_height = pmVar3->m_height;
    this->m_comp_flags = pmVar3->m_comp_flags;
    this->m_format = pmVar3->m_format;
    pvVar4 = (this->m_faces).m_p;
    (this->m_faces).m_p = pvVar2;
    faces->m_p = pvVar4;
    uVar1 = (this->m_faces).m_size;
    (this->m_faces).m_size = faces->m_size;
    faces->m_size = uVar1;
    uVar1 = (this->m_faces).m_capacity;
    (this->m_faces).m_capacity = faces->m_capacity;
    faces->m_capacity = uVar1;
  }
  return;
}

Assistant:

inline bool empty() const
        {
            return !m_size;
        }